

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void __thiscall AActor::CheckSectorTransition(AActor *this,sector_t *oldsec)

{
  ASectorAction *pAVar1;
  sector_t *psVar2;
  double dVar3;
  uint activationType;
  double dVar4;
  double dVar5;
  
  if (this->Sector != oldsec) {
    pAVar1 = (oldsec->SecActTarget).field_0.p;
    if (pAVar1 != (ASectorAction *)0x0) {
      if (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        ASectorAction::TriggerAction(pAVar1,this,2);
      }
      else {
        (oldsec->SecActTarget).field_0.p = (ASectorAction *)0x0;
      }
    }
    psVar2 = this->Sector;
    pAVar1 = (psVar2->SecActTarget).field_0.p;
    if (pAVar1 != (ASectorAction *)0x0) {
      if (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        dVar4 = (this->__Pos).Z;
        dVar5 = (this->__Pos).X;
        dVar3 = (this->__Pos).Y;
        activationType =
             (uint)(dVar4 <= ((psVar2->floorplane).normal.Y * dVar3 +
                             (psVar2->floorplane).D + (psVar2->floorplane).normal.X * dVar5) *
                             (psVar2->floorplane).negiC) * 4 +
             (uint)(((psVar2->ceilingplane).normal.Y * dVar3 +
                    (psVar2->ceilingplane).D + (psVar2->ceilingplane).normal.X * dVar5) *
                    (psVar2->ceilingplane).negiC <= this->Height + dVar4) * 8 + 1;
        psVar2 = psVar2->heightsec;
        if (((psVar2 != (sector_t *)0x0) &&
            (dVar5 = (dVar3 * (psVar2->floorplane).normal.Y +
                     (psVar2->floorplane).D + dVar5 * (psVar2->floorplane).normal.X) *
                     (psVar2->floorplane).negiC, dVar4 == dVar5)) && (!NAN(dVar4) && !NAN(dVar5))) {
          activationType = activationType | 0x400;
        }
        ASectorAction::TriggerAction(pAVar1,this,activationType);
      }
      else {
        (psVar2->SecActTarget).field_0.p = (ASectorAction *)0x0;
      }
    }
    dVar4 = (this->__Pos).Z;
    if ((dVar4 == this->floorz) && (!NAN(dVar4) && !NAN(this->floorz))) {
      P_CheckFor3DFloorHit(this,dVar4);
      dVar4 = (this->__Pos).Z;
    }
    dVar4 = dVar4 + this->Height;
    if ((dVar4 == this->ceilingz) && (!NAN(dVar4) && !NAN(this->ceilingz))) {
      P_CheckFor3DCeilingHit(this,dVar4);
      return;
    }
  }
  return;
}

Assistant:

void AActor::CheckSectorTransition(sector_t *oldsec)
{
	if (oldsec != Sector)
	{
		if (oldsec->SecActTarget != NULL)
		{
			oldsec->SecActTarget->TriggerAction(this, SECSPAC_Exit);
		}
		if (Sector->SecActTarget != NULL)
		{
			int act = SECSPAC_Enter;
			if (Z() <= Sector->floorplane.ZatPoint(this))
			{
				act |= SECSPAC_HitFloor;
			}
			if (Top() >= Sector->ceilingplane.ZatPoint(this))
			{
				act |= SECSPAC_HitCeiling;
			}
			if (Sector->heightsec != NULL && Z() == Sector->heightsec->floorplane.ZatPoint(this))
			{
				act |= SECSPAC_HitFakeFloor;
			}
			Sector->SecActTarget->TriggerAction(this, act);
		}
		if (Z() == floorz)
		{
			P_CheckFor3DFloorHit(this, Z());
		}
		if (Top() == ceilingz)
		{
			P_CheckFor3DCeilingHit(this, Top());
		}
	}
}